

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void ArrayInitEx(array *p,cc_memheap *Heap)

{
  cc_memheap *Heap_local;
  array *p_local;
  
  if (Heap == (cc_memheap *)0x0) {
    p->_Begin = (char *)0x0;
  }
  else {
    if ((Heap->Size & 0x8000000000000000) == 0) {
      __assert_fail("Heap->Size & DATA_FLAG_MEMHEAP",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                    ,0x85,"void ArrayInitEx(array *, const cc_memheap *)");
    }
    p->_Begin = (char *)(Heap + 1);
  }
  p->_Used = 0;
  return;
}

Assistant:

void ArrayInitEx(array* p,const cc_memheap* Heap)
{
    if (Heap == NULL)
        p->_Begin = NULL;
    else
    {
        assert(Heap->Size & DATA_FLAG_MEMHEAP);
        p->_Begin = (void*)Heap->data;
    }
    p->_Used = 0;
}